

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

TemporalBinInfo *
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_2UL>
::TemporalBinInfo::merge2(TemporalBinInfo *a,TemporalBinInfo *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  size_t sVar11;
  TemporalBinInfo *r;
  TemporalBinInfo *in_RDI;
  
  sVar11 = a->count1[0];
  in_RDI->count0[0] = a->count0[0];
  in_RDI->count1[0] = sVar11;
  aVar1 = a->bounds0[0].bounds0.lower.field_0;
  aVar2 = a->bounds0[0].bounds0.upper.field_0;
  aVar3 = a->bounds0[0].bounds1.lower.field_0;
  aVar4 = a->bounds0[0].bounds1.upper.field_0;
  aVar5 = a->bounds1[0].bounds0.lower.field_0;
  aVar6 = a->bounds1[0].bounds0.upper.field_0;
  aVar7 = a->bounds1[0].bounds1.lower.field_0;
  auVar10._0_8_ = in_RDI->count0[0];
  auVar10._8_8_ = in_RDI->count1[0];
  auVar8._0_8_ = b->count0[0];
  auVar8._8_8_ = b->count1[0];
  auVar10 = vpaddq_avx(auVar10,auVar8);
  aVar9 = a->bounds1[0].bounds1.upper.field_0;
  in_RDI->count0[0] = auVar10._0_8_;
  in_RDI->count1[0] = auVar10._8_8_;
  aVar1.m128 = (__m128)vminps_avx(aVar1.m128,b->bounds0[0].bounds0.lower.field_0);
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(aVar2.m128,b->bounds0[0].bounds0.upper.field_0);
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(aVar3.m128,b->bounds0[0].bounds1.lower.field_0);
  in_RDI->bounds0[0].bounds1.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(aVar4.m128,b->bounds0[0].bounds1.upper.field_0);
  in_RDI->bounds0[0].bounds1.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(aVar5.m128,b->bounds1[0].bounds0.lower.field_0);
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(aVar6.m128,b->bounds1[0].bounds0.upper.field_0);
  in_RDI->bounds1[0].bounds0.upper.field_0 = aVar1;
  aVar1.m128 = (__m128)vminps_avx(aVar7.m128,b->bounds1[0].bounds1.lower.field_0);
  in_RDI->bounds1[0].bounds1.lower.field_0 = aVar1;
  aVar1.m128 = (__m128)vmaxps_avx(aVar9.m128,b->bounds1[0].bounds1.upper.field_0);
  in_RDI->bounds1[0].bounds1.upper.field_0 = aVar1;
  return in_RDI;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }